

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

int wiz_map(void)

{
  uint uVar1;
  uint uVar2;
  trap *trap;
  
  uVar2 = u.uprops[0x23].intrinsic;
  uVar1 = u.uprops[0x1c].intrinsic;
  if (flags.debug == '\0') {
    pline("Unavailable command \'^F\'.");
  }
  else {
    u.uprops[0x23].intrinsic = 0;
    u.uprops[0x1c].intrinsic = 0;
    trap = (trap *)&level->lev_traps;
    while (trap = trap->ntrap, trap != (trap *)0x0) {
      trap->field_0x8 = trap->field_0x8 | 0x20;
      map_trap(trap,1);
    }
    do_mapping();
    u.uprops[0x1c].intrinsic = uVar1;
    u.uprops[0x23].intrinsic = uVar2;
  }
  return 0;
}

Assistant:

static int wiz_map(void)
{
	if (wizard) {
	    struct trap *t;
	    long save_Hconf = HConfusion,
		 save_Hhallu = HHallucination;

	    HConfusion = HHallucination = 0L;
	    for (t = level->lev_traps; t != 0; t = t->ntrap) {
		t->tseen = 1;
		map_trap(t, TRUE);
	    }
	    do_mapping();
	    HConfusion = save_Hconf;
	    HHallucination = save_Hhallu;
	} else
	    pline("Unavailable command '^F'.");
	return 0;
}